

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-opt.cpp
# Opt level: O0

void ggml_opt_eval_graph(ggml_opt_context_t opt_ctx,ggml_cgraph *graph,ggml_opt_result *result)

{
  long lVar1;
  _Bool _Var2;
  undefined1 uVar3;
  float *pfVar4;
  size_type sVar5;
  iterator tensor;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar6;
  float fVar7;
  int64_t ncorrect;
  vector<int,_std::allocator<int>_> pred;
  float loss;
  int64_t ndata;
  float *adamw_par_data;
  float beta2h;
  float beta1h;
  ggml_opt_optimizer_params opt_pars;
  ggml_cgraph *in_stack_fffffffffffffed8;
  ggml_backend_sched_t in_stack_fffffffffffffee0;
  undefined7 in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffeef;
  allocator_type *in_stack_fffffffffffffef0;
  vector<int,_std::allocator<int>_> *this;
  ggml_tensor *in_stack_fffffffffffffef8;
  ggml_tensor *tensor_00;
  ggml_tensor *in_stack_ffffffffffffff00;
  ggml_cgraph *in_stack_ffffffffffffff18;
  ggml_opt_context_t in_stack_ffffffffffffff20;
  vector<int,_std::allocator<int>_> *this_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  const_iterator __position;
  long local_b8;
  int local_69 [2];
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  float local_1c;
  long *local_18;
  long local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_RSI != *(long *)(in_RDI + 0x1400)) {
    (**(code **)(in_RDI + 0x1430))(&local_2c,*(undefined8 *)(in_RDI + 0x1438));
    if (local_2c <= 0.0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x24d,"GGML_ASSERT(%s) failed","opt_pars.adamw.alpha > 0.0f");
    }
    if (local_28 < 0.0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x24e,"GGML_ASSERT(%s) failed","opt_pars.adamw.beta1 >= 0.0f");
    }
    if (1.0 < local_28) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x24f,"GGML_ASSERT(%s) failed","opt_pars.adamw.beta1 <= 1.0f");
    }
    if (local_24 < 0.0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x250,"GGML_ASSERT(%s) failed","opt_pars.adamw.beta2 >= 0.0f");
    }
    if (1.0 < local_24) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x251,"GGML_ASSERT(%s) failed","opt_pars.adamw.beta2 <= 1.0f");
    }
    if (local_20 < 0.0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x252,"GGML_ASSERT(%s) failed","opt_pars.adamw.eps >= 0.0f");
    }
    if (local_1c < 0.0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x253,"GGML_ASSERT(%s) failed","opt_pars.adamw.wd >= 0.0f");
    }
    if (1.0 < local_1c) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x254,"GGML_ASSERT(%s) failed","opt_pars.adamw.wd <= 1.0f");
    }
    fVar6 = powf(local_28,(float)*(long *)(local_8 + 0x1418));
    fVar7 = powf(local_24,(float)*(long *)(local_8 + 0x1418));
    pfVar4 = ggml_get_data_f32(*(ggml_tensor **)(local_8 + 0x1440));
    *pfVar4 = local_2c;
    pfVar4[1] = local_28;
    pfVar4[2] = local_24;
    pfVar4[3] = local_20;
    pfVar4[4] = local_1c;
    pfVar4[5] = 1.0 / (1.0 - fVar6);
    pfVar4[6] = 1.0 / (1.0 - fVar7);
  }
  ggml_opt_alloc_graph(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  ggml_backend_sched_graph_compute(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  *(ulong *)(local_8 + 0x1418) =
       (ulong)(*(long *)(local_8 + 8) == *(long *)(local_8 + 0x1410)) + *(long *)(local_8 + 0x1418);
  if (local_18 != (long *)0x0) {
    if (*local_18 == 0) {
      *(byte *)(local_18 + 9) = *(byte *)(local_8 + 0x1428) & 1;
      local_18[8] = (long)*(int *)(local_8 + 0x1420);
    }
    else {
      if ((*(byte *)(local_18 + 9) & 1) != (*(byte *)(local_8 + 0x1428) & 1)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                   ,0x270,"GGML_ASSERT(%s) failed",
                   "result->loss_per_datapoint == opt_ctx->loss_per_datapoint");
      }
      if (local_18[8] != (long)*(int *)(local_8 + 0x1420)) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                   ,0x271,"GGML_ASSERT(%s) failed","result->opt_period == opt_ctx->opt_period");
      }
    }
    this_00 = *(vector<int,_std::allocator<int>_> **)(*(long *)(local_8 + 0x13d8) + 0x18);
    lVar1 = *local_18;
    __position._M_current = (int *)this_00;
    sVar5 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(local_18 + 1));
    if (lVar1 != (long)__position._M_current * sVar5) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x275,"GGML_ASSERT(%s) failed",
                 "result->ndata == ndata*int64_t(result->loss.size()) && \"varying batch size not supported\""
                );
    }
    *local_18 = (long)&(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start + *local_18;
    _Var2 = ggml_is_scalar(*(ggml_tensor **)(local_8 + 0x13e8));
    if (!_Var2) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x278,"GGML_ASSERT(%s) failed","ggml_is_scalar(opt_ctx->loss)");
    }
    if (**(int **)(local_8 + 0x13e8) != 0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x279,"GGML_ASSERT(%s) failed","opt_ctx->loss->type == GGML_TYPE_F32");
    }
    __first._M_current = *(int **)(local_8 + 0x13e8);
    ggml_nbytes(in_stack_fffffffffffffef8);
    ggml_backend_tensor_get
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
               ,CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef0,
               (value_type_conflict *)CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8))
    ;
    if (**(int **)(local_8 + 0x13f0) != 0x1a) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                 ,0x27e,"GGML_ASSERT(%s) failed","opt_ctx->pred->type == GGML_TYPE_I32");
    }
    __last._M_current = local_69;
    std::allocator<int>::allocator((allocator<int> *)0x1670f0);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff00,
               (size_type)in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::allocator<int>::~allocator((allocator<int> *)0x167116);
    std::vector<int,_std::allocator<int>_>::data((vector<int,_std::allocator<int>_> *)0x167137);
    ggml_nbytes(in_stack_fffffffffffffef8);
    ggml_backend_tensor_get
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(size_t)in_stack_fffffffffffffef0
               ,CONCAT17(in_stack_fffffffffffffeef,in_stack_fffffffffffffee8));
    tensor_00 = (ggml_tensor *)(local_18 + 4);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffee0,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               in_stack_fffffffffffffed8);
    this = (vector<int,_std::allocator<int>_> *)((long)local_69 + 1);
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8);
    std::vector<int,_std::allocator<int>_>::end
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffed8);
    tensor = std::vector<int,std::allocator<int>>::
             insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                       (this_00,__position,__first,__last);
    if ((*(long *)(local_8 + 0x13e0) == 0) || (local_18[7] < 0)) {
      local_18[7] = -1;
    }
    else {
      uVar3 = ggml_is_scalar(*(ggml_tensor **)(local_8 + 0x13f8));
      if (!(bool)uVar3) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                   ,0x288,"GGML_ASSERT(%s) failed","ggml_is_scalar(opt_ctx->ncorrect)");
      }
      if (**(int **)(local_8 + 0x13f8) != 0x1b) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-opt.cpp"
                   ,0x289,"GGML_ASSERT(%s) failed","opt_ctx->ncorrect->type == GGML_TYPE_I64");
      }
      ggml_nbytes(tensor_00);
      ggml_backend_tensor_get
                ((ggml_tensor *)tensor._M_current,tensor_00,(size_t)this,
                 CONCAT17(uVar3,in_stack_fffffffffffffee8));
      local_18[7] = local_b8 + local_18[7];
    }
    std::vector<int,_std::allocator<int>_>::~vector(this);
  }
  return;
}

Assistant:

static void ggml_opt_eval_graph(ggml_opt_context_t opt_ctx, ggml_cgraph * graph, ggml_opt_result * result) {
    if (graph != opt_ctx->gf) {
        struct ggml_opt_optimizer_params opt_pars = opt_ctx->get_opt_pars(opt_ctx->get_opt_pars_ud);

        GGML_ASSERT(opt_pars.adamw.alpha >  0.0f);
        GGML_ASSERT(opt_pars.adamw.beta1 >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.beta1 <= 1.0f);
        GGML_ASSERT(opt_pars.adamw.beta2 >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.beta2 <= 1.0f);
        GGML_ASSERT(opt_pars.adamw.eps   >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.wd    >= 0.0f);
        GGML_ASSERT(opt_pars.adamw.wd    <= 1.0f);

        // beta1, beta2 after applying warmup
        const float beta1h = 1.0f/(1.0f - powf(opt_pars.adamw.beta1, opt_ctx->iter));
        const float beta2h = 1.0f/(1.0f - powf(opt_pars.adamw.beta2, opt_ctx->iter));

        float * adamw_par_data = ggml_get_data_f32(opt_ctx->adamw_params);
        adamw_par_data[0] = opt_pars.adamw.alpha;
        adamw_par_data[1] = opt_pars.adamw.beta1;
        adamw_par_data[2] = opt_pars.adamw.beta2;
        adamw_par_data[3] = opt_pars.adamw.eps;
        adamw_par_data[4] = opt_pars.adamw.wd;
        adamw_par_data[5] = beta1h;
        adamw_par_data[6] = beta2h;
    }

    ggml_opt_alloc_graph(opt_ctx, graph);
    ggml_backend_sched_graph_compute(opt_ctx->backend_sched, opt_ctx->allocated_graph_copy);
    opt_ctx->iter += opt_ctx->allocated_graph == opt_ctx->gb_opt;

    if (!result) {
        return;
    }

    if (result->ndata == 0) {
        result->loss_per_datapoint = opt_ctx->loss_per_datapoint;
        result->opt_period         = opt_ctx->opt_period;
    } else {
        GGML_ASSERT(result->loss_per_datapoint == opt_ctx->loss_per_datapoint);
        GGML_ASSERT(result->opt_period         == opt_ctx->opt_period);
    }

    const int64_t ndata = opt_ctx->outputs->ne[1];
    GGML_ASSERT(result->ndata == ndata*int64_t(result->loss.size()) && "varying batch size not supported");
    result->ndata += ndata;

    GGML_ASSERT(ggml_is_scalar(opt_ctx->loss));
    GGML_ASSERT(opt_ctx->loss->type == GGML_TYPE_F32);
    float loss;
    ggml_backend_tensor_get(opt_ctx->loss, &loss, 0, ggml_nbytes(opt_ctx->loss));
    result->loss.push_back(loss);

    GGML_ASSERT(opt_ctx->pred->type == GGML_TYPE_I32);
    std::vector<int32_t> pred(ndata);
    ggml_backend_tensor_get(opt_ctx->pred, pred.data(), 0, ggml_nbytes(opt_ctx->pred));
    result->pred.insert(result->pred.end(), pred.begin(), pred.end());

    if (!opt_ctx->labels || result->ncorrect < 0) {
        result->ncorrect = -1;
        return;
    }

    GGML_ASSERT(ggml_is_scalar(opt_ctx->ncorrect));
    GGML_ASSERT(opt_ctx->ncorrect->type == GGML_TYPE_I64);
    int64_t ncorrect;
    ggml_backend_tensor_get(opt_ctx->ncorrect, &ncorrect, 0, ggml_nbytes(opt_ctx->ncorrect));
    result->ncorrect += ncorrect;
}